

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262_slice.c
# Opt level: O0

int h262_macroblock(bitstream *str,h262_seqparm *seqparm,h262_picparm *picparm,h262_macroblock *mb,
                   uint32_t *qsc)

{
  uint s;
  int iVar1;
  int iVar2;
  h262_picparm *in_RCX;
  h262_macroblock *mb_00;
  h262_seqparm *in_RDX;
  bitstream *in_RSI;
  int *in_RDI;
  h262_macroblock *in_R8;
  int32_t *unaff_retaddr;
  h262_picparm *in_stack_00000008;
  int i;
  uint32_t mb_flags;
  vs_vlc_val *in_stack_00000058;
  uint32_t *in_stack_00000060;
  bitstream *in_stack_00000068;
  uint32_t in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_fffffffffffffff8;
  int in_stack_fffffffffffffffc;
  
  s = in_RCX->picture_coding_type | in_RCX->vbv_delay * 2 | in_RCX->full_pel_forward_vector << 2 |
      in_RCX->forward_f_code << 3 | in_RCX->full_pel_backward_vector << 4;
  mb_00 = (h262_macroblock *)(ulong)(in_RDX->vertical_size - 1);
  switch(mb_00) {
  case (h262_macroblock *)0x0:
    iVar1 = vs_vlc(in_stack_00000068,in_stack_00000060,in_stack_00000058);
    if (iVar1 != 0) {
      return 1;
    }
    break;
  case (h262_macroblock *)0x1:
    iVar1 = vs_vlc(in_stack_00000068,in_stack_00000060,in_stack_00000058);
    if (iVar1 != 0) {
      return 1;
    }
    break;
  case (h262_macroblock *)0x2:
    iVar1 = vs_vlc(in_stack_00000068,in_stack_00000060,in_stack_00000058);
    if (iVar1 != 0) {
      return 1;
    }
    break;
  case (h262_macroblock *)0x3:
    iVar1 = vs_vlc(in_stack_00000068,in_stack_00000060,in_stack_00000058);
    if (iVar1 != 0) {
      return 1;
    }
    break;
  default:
    fprintf(_stderr,"Invalid picture type\n");
    return 1;
  }
  if (*in_RDI == 1) {
    in_RCX->temporal_reference = 0;
    in_RCX->picture_coding_type = s & 1;
    in_RCX->vbv_delay = s >> 1 & 1;
    in_RCX->full_pel_forward_vector = s >> 2 & 1;
    in_RCX->forward_f_code = s >> 3 & 1;
    in_RCX->full_pel_backward_vector = s >> 4 & 1;
  }
  if ((in_RCX->vbv_delay == 0) && (in_RCX->full_pel_forward_vector == 0)) {
    if (in_RDX->intra_quantiser_matrix[5] == 3) {
      iVar1 = vs_infer((bitstream *)CONCAT44(s,in_stack_ffffffffffffffc8),&mb_00->macroblock_skipped
                       ,in_stack_ffffffffffffffbc);
      if (iVar1 != 0) {
        return 1;
      }
    }
    else {
      iVar1 = vs_infer((bitstream *)CONCAT44(s,in_stack_ffffffffffffffc8),&mb_00->macroblock_skipped
                       ,in_stack_ffffffffffffffbc);
      if (iVar1 != 0) {
        return 1;
      }
    }
  }
  else if (in_RDX->intra_quantiser_matrix[5] == 3) {
    if (in_RDX->intra_quantiser_matrix[7] == 0) {
      iVar1 = vs_u((bitstream *)CONCAT44(s,in_stack_ffffffffffffffc8),&mb_00->macroblock_skipped,
                   in_stack_ffffffffffffffbc);
      if (iVar1 != 0) {
        return 1;
      }
      if (in_RCX->backward_f_code == 0) {
        fprintf(_stderr,"Invalid frame_motion_type\n");
        return 1;
      }
    }
    else {
      iVar1 = vs_infer((bitstream *)CONCAT44(s,in_stack_ffffffffffffffc8),&mb_00->macroblock_skipped
                       ,in_stack_ffffffffffffffbc);
      if (iVar1 != 0) {
        return 1;
      }
    }
  }
  else {
    iVar1 = vs_u((bitstream *)CONCAT44(s,in_stack_ffffffffffffffc8),&mb_00->macroblock_skipped,
                 in_stack_ffffffffffffffbc);
    if (iVar1 != 0) {
      return 1;
    }
    if (in_RCX->is_ext == 0) {
      fprintf(_stderr,"Invalid field_motion_type\n");
      return 1;
    }
  }
  if (((in_RDX->intra_quantiser_matrix[5] == 3) && (in_RDX->intra_quantiser_matrix[7] == 0)) &&
     ((in_RCX->full_pel_backward_vector != 0 || (in_RCX->forward_f_code != 0)))) {
    iVar1 = vs_u((bitstream *)CONCAT44(s,in_stack_ffffffffffffffc8),&mb_00->macroblock_skipped,
                 in_stack_ffffffffffffffbc);
    if (iVar1 != 0) {
      return 1;
    }
  }
  else {
    iVar1 = vs_infer((bitstream *)CONCAT44(s,in_stack_ffffffffffffffc8),&mb_00->macroblock_skipped,
                     in_stack_ffffffffffffffbc);
    if (iVar1 != 0) {
      return 1;
    }
  }
  if (in_RCX->picture_coding_type == 0) {
    iVar1 = vs_infer((bitstream *)CONCAT44(s,in_stack_ffffffffffffffc8),&mb_00->macroblock_skipped,
                     in_stack_ffffffffffffffbc);
    if (iVar1 != 0) {
      return 1;
    }
  }
  else {
    iVar1 = vs_u((bitstream *)CONCAT44(s,in_stack_ffffffffffffffc8),&mb_00->macroblock_skipped,
                 in_stack_ffffffffffffffbc);
    if (iVar1 != 0) {
      return 1;
    }
  }
  in_R8->macroblock_skipped = in_RCX->f_code[0][1];
  if ((in_RCX->vbv_delay == 0) &&
     ((in_RCX->full_pel_backward_vector == 0 || (in_RDX->intra_quantiser_matrix[8] == 0)))) {
    iVar1 = h262_infer_vectors((bitstream *)in_RCX,(h262_seqparm *)in_R8,
                               (h262_picparm *)CONCAT44(s,in_stack_ffffffffffffffc8),mb_00,
                               in_stack_ffffffffffffffbc);
    if (iVar1 != 0) {
      return 1;
    }
  }
  else {
    iVar1 = h262_motion_vectors(in_RSI,in_RDX,in_RCX,in_R8,s);
    if (iVar1 != 0) {
      return 1;
    }
  }
  if (in_RCX->full_pel_forward_vector == 0) {
    iVar1 = h262_infer_vectors((bitstream *)in_RCX,(h262_seqparm *)in_R8,
                               (h262_picparm *)CONCAT44(s,in_stack_ffffffffffffffc8),mb_00,
                               in_stack_ffffffffffffffbc);
    iVar2 = (int)((ulong)in_R8 >> 0x20);
    if (iVar1 != 0) {
      return 1;
    }
  }
  else {
    iVar1 = h262_motion_vectors(in_RSI,in_RDX,in_RCX,in_R8,s);
    iVar2 = (int)((ulong)in_R8 >> 0x20);
    if (iVar1 != 0) {
      return 1;
    }
  }
  if (((in_RCX->full_pel_backward_vector == 0) || (in_RDX->intra_quantiser_matrix[8] == 0)) ||
     (iVar1 = vs_mark((bitstream *)CONCAT44(s,in_stack_ffffffffffffffc8),
                      (uint32_t)((ulong)mb_00 >> 0x20),(int)mb_00), iVar1 == 0)) {
    if (in_RCX->full_pel_backward_vector == 0) {
      if (in_RCX->forward_f_code == 0) {
        iVar1 = vs_infer((bitstream *)CONCAT44(s,in_stack_ffffffffffffffc8),
                         &mb_00->macroblock_skipped,in_stack_ffffffffffffffbc);
        if (iVar1 != 0) {
          return 1;
        }
      }
      else {
        iVar1 = h262_coded_block_pattern
                          ((bitstream *)in_RCX,iVar2,
                           (uint32_t *)CONCAT44(s,in_stack_ffffffffffffffc8));
        if (iVar1 != 0) {
          return 1;
        }
      }
    }
    else {
      iVar1 = vs_infer((bitstream *)CONCAT44(s,in_stack_ffffffffffffffc8),&mb_00->macroblock_skipped
                       ,in_stack_ffffffffffffffbc);
      if (iVar1 != 0) {
        return 1;
      }
    }
    for (iVar1 = 0; iVar1 < h262_macroblock::block_count[in_RSI[10].dir]; iVar1 = iVar1 + 1) {
      if (((in_RCX->intra_quantiser_matrix[2] & 1 << ((byte)iVar1 & 0x1f)) != 0) &&
         (iVar2 = h262_block((bitstream *)qsc,_i,in_stack_00000008,unaff_retaddr,
                             in_stack_fffffffffffffffc,in_stack_fffffffffffffff8), iVar2 != 0)) {
        return 1;
      }
    }
    if ((in_RDX->vertical_size == 4) &&
       (iVar1 = vs_mark((bitstream *)CONCAT44(s,iVar1),(uint32_t)((ulong)mb_00 >> 0x20),(int)mb_00),
       iVar1 != 0)) {
      iVar1 = 1;
    }
    else {
      iVar1 = 0;
    }
  }
  else {
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int h262_macroblock(struct bitstream *str, struct h262_seqparm *seqparm, struct h262_picparm *picparm, struct h262_macroblock *mb, uint32_t *qsc) {
	uint32_t mb_flags = mb->macroblock_quant
		| mb->macroblock_motion_forward << 1
		| mb->macroblock_motion_backward << 2
		| mb->macroblock_pattern << 3
		| mb->macroblock_intra << 4;
	switch (picparm->picture_coding_type) {
		case H262_PIC_TYPE_I:
			if (vs_vlc(str, &mb_flags, mbf_i_vlc)) return 1;
			break;
		case H262_PIC_TYPE_P:
			if (vs_vlc(str, &mb_flags, mbf_p_vlc)) return 1;
			break;
		case H262_PIC_TYPE_B:
			if (vs_vlc(str, &mb_flags, mbf_b_vlc)) return 1;
			break;
		case H262_PIC_TYPE_D:
			if (vs_vlc(str, &mb_flags, mbf_d_vlc)) return 1;
			break;
		default:
			fprintf(stderr, "Invalid picture type\n");
			return 1;
	}
	if (str->dir == VS_DECODE) {
		mb->macroblock_skipped = 0;
		mb->macroblock_quant = mb_flags >> 0 & 1;
		mb->macroblock_motion_forward = mb_flags >> 1 & 1;
		mb->macroblock_motion_backward = mb_flags >> 2 & 1;
		mb->macroblock_pattern = mb_flags >> 3 & 1;
		mb->macroblock_intra = mb_flags >> 4 & 1;
	}
	if (mb->macroblock_motion_forward || mb->macroblock_motion_backward) {
		if (picparm->picture_structure == H262_PIC_STRUCT_FRAME) {
			if (picparm->frame_pred_frame_dct) {
				if (vs_infer(str, &mb->frame_motion_type, H262_FRAME_MOTION_FRAME)) return 1;
			} else {
				if (vs_u(str, &mb->frame_motion_type, 2)) return 1;
				if (!mb->frame_motion_type) {
					fprintf(stderr, "Invalid frame_motion_type\n");
					return 1;
				}
			}
		} else {
			if (vs_u(str, &mb->field_motion_type, 2)) return 1;
			if (!mb->field_motion_type) {
				fprintf(stderr, "Invalid field_motion_type\n");
				return 1;
			}
		}
	} else {
		if (picparm->picture_structure == H262_PIC_STRUCT_FRAME) {
			if (vs_infer(str, &mb->frame_motion_type, H262_FRAME_MOTION_FRAME)) return 1;
		} else {
			if (vs_infer(str, &mb->field_motion_type, H262_FIELD_MOTION_FIELD)) return 1;
		}
	}
	if (picparm->picture_structure == H262_PIC_STRUCT_FRAME && !picparm->frame_pred_frame_dct && (mb->macroblock_intra || mb->macroblock_pattern)) {
		if (vs_u(str, &mb->dct_type, 1)) return 1;
	} else {
		if (vs_infer(str, &mb->dct_type, 0)) return 1;
	}
	if (mb->macroblock_quant) {
		if (vs_u(str, &mb->quantiser_scale_code, 5)) return 1;
	} else {
		if (vs_infer(str, &mb->quantiser_scale_code, *qsc)) return 1;
	}
	*qsc = mb->quantiser_scale_code;
	if (mb->macroblock_motion_forward || (mb->macroblock_intra && picparm->concealment_motion_vectors)) {
		if (h262_motion_vectors(str, seqparm, picparm, mb, 0)) return 1;
	} else {
		if (h262_infer_vectors(str, seqparm, picparm, mb, 0)) return 1;
	}
	if (mb->macroblock_motion_backward) {
		if (h262_motion_vectors(str, seqparm, picparm, mb, 1)) return 1;
	} else {
		if (h262_infer_vectors(str, seqparm, picparm, mb, 1)) return 1;
	}
	if (mb->macroblock_intra && picparm->concealment_motion_vectors)
		if (vs_mark(str, 1, 1)) return 1;
	static const int block_count[4] = { 4, 6, 8, 12 };
	if (mb->macroblock_intra) {
		if (vs_infer(str, &mb->coded_block_pattern, (1 << block_count[seqparm->chroma_format]) - 1)) return 1;
	} else if (mb->macroblock_pattern) {
		if (h262_coded_block_pattern(str, seqparm->chroma_format, &mb->coded_block_pattern)) return 1;
	} else {
		if (vs_infer(str, &mb->coded_block_pattern, 0)) return 1;
	}
	int i;
	for (i = 0; i < block_count[seqparm->chroma_format]; i++)
		if (mb->coded_block_pattern & 1 << i) {
			if (h262_block(str, seqparm, picparm, mb->block[i], mb->macroblock_intra, i >= 4)) return 1;
		}
	if (picparm->picture_coding_type == H262_PIC_TYPE_D)
		if (vs_mark(str, 1, 1)) return 1;
	return 0;
}